

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::isAdjoint(Graph *this)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int k;
  ulong uVar14;
  
  if (this->multigraph_status == true) {
    std::operator<<((ostream *)&std::cerr,"Graph is multigraph! Can\'t be adjoint!");
    exit(1);
  }
  uVar1 = this->num_of_vert;
  uVar4 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  uVar10 = 0;
  do {
    if (uVar4 == uVar8) {
      return;
    }
    piVar2 = this->adj_list[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = this->adj_list[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar2 != piVar3) {
      uVar11 = (long)piVar3 - (long)piVar2 >> 2;
      uVar12 = 0;
      if (0 < (int)uVar11) {
        uVar12 = uVar11 & 0xffffffff;
      }
      for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
        if (uVar4 != uVar5) {
          iVar6 = 0;
          for (uVar14 = 0; uVar14 != uVar12; uVar14 = uVar14 + 1) {
            piVar3 = this->adj_list[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = (long)this->adj_list[uVar5].super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
            uVar13 = uVar9;
            if (uVar9 < uVar11) {
              uVar13 = uVar11;
            }
            uVar7 = 0;
            if (0 < (int)uVar9) {
              uVar7 = uVar9 & 0xffffffff;
            }
            for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
              iVar6 = iVar6 + (uint)(piVar2[uVar14] == piVar3[uVar9]);
              uVar10 = uVar13 & 0xffffffff;
            }
          }
          if (iVar6 != (int)uVar10 && iVar6 != 0) {
            this->adjoint_status = false;
            return;
          }
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void Graph::isAdjoint(){
   if(this->multigraph_status){
      cerr << "Graph is multigraph! Can't be adjoint!";
      exit(EXIT_FAILURE);
   }
   int nv = this->num_of_vert, size = 0, common_els = 0;
   for(int i = 0; i < nv; i++){
      // checks if there is any vertex that has any successors
      if(not(this->adj_list[i].empty()))
         for(int j = 0; j < nv; j++){
            if (i == j)
               continue;
            common_els = 0;
            if(this->adj_list[i].empty() and this->adj_list[j].empty())
               continue;
            for(int k = 0; k < (int)this->adj_list[i].size(); k++){
               for(int l = 0; l < (int)this->adj_list[j].size(); l++){
                  // sets the number of our common elements
                  if(this->adj_list[i].size() >= this->adj_list[j].size())
                     size = (int)this->adj_list[i].size();
                  else
                     size = (int)this->adj_list[j].size();
                  // if we found common element, then we increment
                  if(this->adj_list[i][k] == this->adj_list[j][l])
                     common_els++;
               }
            }
            // graph not adjoint; common elements for two vertices are not equal and this is not empty set
            if((common_els not_eq size) and
               (common_els not_eq 0)){
               this->adjoint_status = false;
               return void();
            }
         }
   }
   return void();
}